

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

void nes_inesmir(int *ip)

{
  int iVar1;
  int svalue;
  int *ip_local;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (((int)value < 0) || (0xf < (int)value)) {
      error("Mirror value out of range!");
    }
    else {
      ines_mapper[0] = value & 0xf | ines_mapper[0] & 0xf0U;
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
nes_inesmir(int *ip)
{
	if (!evaluate(ip, ';'))
		return;

    int svalue = (int)value;
	if ((svalue < 0) || (svalue > 15)) 
	{
		error("Mirror value out of range!");
	
		return;
	}
	
	ines_mapper[0] &= 0xF0;
	ines_mapper[0] |= (value  & 0x0F);

	if (pass == LAST_PASS) 
	{
		println();
	}
}